

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

sunrealtype N_VMin_SensWrapper(N_Vector x)

{
  long *plVar1;
  long lVar2;
  sunrealtype sVar3;
  sunrealtype sVar4;
  
  sVar3 = N_VMin((N_Vector)**x->content);
  plVar1 = (long *)x->content;
  if (1 < (int)plVar1[1]) {
    lVar2 = 1;
    sVar4 = sVar3;
    do {
      sVar3 = N_VMin(*(N_Vector *)(*plVar1 + lVar2 * 8));
      if (sVar4 <= sVar3) {
        sVar3 = sVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
      sVar4 = sVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return sVar3;
}

Assistant:

sunrealtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  sunrealtype min, tmp;

  min = N_VMin(NV_VEC_SW(x, 0));

  for (i = 1; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VMin(NV_VEC_SW(x, i));
    if (tmp < min) { min = tmp; }
  }

  return (min);
}